

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnumValue
          (DescriptorBuilder *this,EnumValueDescriptorProto *proto,EnumDescriptor *parent,
          EnumValueDescriptor *result)

{
  Symbol symbol;
  bool bVar1;
  int32 iVar2;
  string *psVar3;
  string *name;
  long lVar4;
  DescriptorBuilder *this_00;
  ulong uVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Descriptor *this_01;
  EnumValueDescriptor *in_RCX;
  EnumDescriptor *in_RDX;
  long in_RDI;
  Message *in_stack_00000038;
  string *in_stack_00000040;
  void *in_stack_00000048;
  string *in_stack_00000050;
  DescriptorBuilder *in_stack_00000058;
  Symbol in_stack_00000070;
  string outer_scope;
  bool added_to_inner_scope;
  bool added_to_outer_scope;
  size_t scope_len;
  string *full_name;
  anon_union_8_8_13f84498_for_Symbol_2 __rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  Tables *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  Tables *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  int options_field_tag;
  EnumValueDescriptor *in_stack_fffffffffffffe00;
  OptionsType *in_stack_fffffffffffffe08;
  DescriptorBuilder *in_stack_fffffffffffffe10;
  Message *in_stack_fffffffffffffe38;
  string local_190 [32];
  string *in_stack_fffffffffffffe90;
  ErrorLocation in_stack_fffffffffffffe9c;
  Message *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  DescriptorBuilder *in_stack_fffffffffffffeb0;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [48];
  string local_80 [32];
  Symbol local_60;
  undefined1 local_49;
  Symbol local_48;
  byte local_31;
  DescriptorBuilder *local_30;
  string *local_28;
  EnumValueDescriptor *local_20;
  EnumDescriptor *local_18;
  
  options_field_tag = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  psVar6 = *(string **)(in_RDI + 8);
  local_20 = in_RCX;
  local_18 = in_RDX;
  EnumValueDescriptorProto::name_abi_cxx11_((EnumValueDescriptorProto *)0x4c3f80);
  psVar3 = DescriptorPool::Tables::AllocateString
                     (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  *(string **)local_20 = psVar3;
  iVar2 = EnumValueDescriptorProto::number((EnumValueDescriptorProto *)0x4c3fab);
  *(int32 *)(local_20 + 0x10) = iVar2;
  *(EnumDescriptor **)(local_20 + 0x18) = local_18;
  local_28 = DescriptorPool::Tables::AllocateEmptyString_abi_cxx11_(in_stack_fffffffffffffdd0);
  name = (string *)std::__cxx11::string::size();
  lVar4 = std::__cxx11::string::size();
  psVar3 = local_28;
  this_00 = (DescriptorBuilder *)((long)name - lVar4);
  local_30 = this_00;
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)psVar3);
  psVar3 = local_28;
  uVar5 = std::__cxx11::string::data();
  std::__cxx11::string::append((char *)psVar3,uVar5);
  std::__cxx11::string::append((string *)local_28);
  *(string **)(local_20 + 8) = local_28;
  EnumValueDescriptorProto::name_abi_cxx11_((EnumValueDescriptorProto *)0x4c40de);
  ValidateSymbolName(this_00,name,psVar6,in_stack_fffffffffffffe38);
  bVar1 = EnumValueDescriptorProto::has_options((EnumValueDescriptorProto *)0x4c410b);
  if (bVar1) {
    EnumValueDescriptorProto::options((EnumValueDescriptorProto *)0x4c412e);
    AllocateOptions<google::protobuf::EnumValueDescriptor>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               options_field_tag);
  }
  else {
    *(undefined8 *)(local_20 + 0x20) = 0;
  }
  psVar6 = EnumValueDescriptor::full_name_abi_cxx11_(local_20);
  EnumDescriptor::containing_type(local_18);
  EnumValueDescriptor::name_abi_cxx11_(local_20);
  Symbol::Symbol(&local_48,local_20);
  local_31 = AddSymbol(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                       in_stack_00000038,in_stack_00000070);
  EnumValueDescriptor::name_abi_cxx11_(local_20);
  Symbol::Symbol(&local_60,local_20);
  symbol.field_1.descriptor = in_stack_fffffffffffffdf0.descriptor;
  symbol._0_8_ = in_stack_fffffffffffffde8;
  local_49 = FileDescriptorTables::AddAliasUnderParent
                       ((FileDescriptorTables *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        (string *)in_stack_fffffffffffffdd0,symbol);
  if (((bool)local_49) && ((local_31 & 1) == 0)) {
    std::__cxx11::string::string(local_80);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            EnumDescriptor::containing_type(local_18);
    if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      psVar3 = FileDescriptor::package_abi_cxx11_(*(FileDescriptor **)(in_RDI + 0x58));
      std::__cxx11::string::operator=(local_80,(string *)psVar3);
      __rhs_00 = local_48.field_1;
    }
    else {
      this_01 = EnumDescriptor::containing_type(local_18);
      psVar3 = Descriptor::full_name_abi_cxx11_(this_01);
      std::__cxx11::string::operator=(local_80,(string *)psVar3);
      __rhs_00 = local_48.field_1;
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::operator+((char *)psVar6,__rhs);
      std::operator+(in_stack_fffffffffffffdc8,(char *)__rhs_00.descriptor);
      std::__cxx11::string::operator=(local_80,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
    }
    else {
      std::__cxx11::string::operator=(local_80,"the global scope");
    }
    in_stack_fffffffffffffde0 = (Tables *)EnumValueDescriptor::full_name_abi_cxx11_(local_20);
    in_stack_fffffffffffffdd8 = EnumValueDescriptor::name_abi_cxx11_(local_20);
    std::operator+((char *)psVar6,__rhs);
    std::operator+(in_stack_fffffffffffffdc8,(char *)__rhs_00.descriptor);
    std::operator+(in_stack_fffffffffffffdc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __rhs_00.descriptor);
    std::operator+(in_stack_fffffffffffffdc8,(char *)__rhs_00.descriptor);
    psVar6 = EnumDescriptor::name_abi_cxx11_(local_18);
    std::operator+(psVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __rhs_00.descriptor);
    std::operator+(psVar6,(char *)__rhs_00.descriptor);
    AddError(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_80);
  }
  FileDescriptorTables::AddEnumValueByNumber
            ((FileDescriptorTables *)in_stack_fffffffffffffde0,
             (EnumValueDescriptor *)in_stack_fffffffffffffdd8);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnumValue(const EnumValueDescriptorProto& proto,
                                       const EnumDescriptor* parent,
                                       EnumValueDescriptor* result) {
  result->name_ = tables_->AllocateString(proto.name());
  result->number_ = proto.number();
  result->type_ = parent;

  // Note:  full_name for enum values is a sibling to the parent's name, not a
  //   child of it.
  std::string* full_name = tables_->AllocateEmptyString();
  size_t scope_len = parent->full_name_->size() - parent->name_->size();
  full_name->reserve(scope_len + result->name_->size());
  full_name->append(parent->full_name_->data(), scope_len);
  full_name->append(*result->name_);
  result->full_name_ = full_name;

  ValidateSymbolName(proto.name(), *full_name, proto);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    EnumValueDescriptorProto::kOptionsFieldNumber);
  }

  // Again, enum values are weird because we makes them appear as siblings
  // of the enum type instead of children of it.  So, we use
  // parent->containing_type() as the value's parent.
  bool added_to_outer_scope =
      AddSymbol(result->full_name(), parent->containing_type(), result->name(),
                proto, Symbol(result));

  // However, we also want to be able to search for values within a single
  // enum type, so we add it as a child of the enum type itself, too.
  // Note:  This could fail, but if it does, the error has already been
  //   reported by the above AddSymbol() call, so we ignore the return code.
  bool added_to_inner_scope =
      file_tables_->AddAliasUnderParent(parent, result->name(), Symbol(result));

  if (added_to_inner_scope && !added_to_outer_scope) {
    // This value did not conflict with any values defined in the same enum,
    // but it did conflict with some other symbol defined in the enum type's
    // scope.  Let's print an additional error to explain this.
    std::string outer_scope;
    if (parent->containing_type() == nullptr) {
      outer_scope = file_->package();
    } else {
      outer_scope = parent->containing_type()->full_name();
    }

    if (outer_scope.empty()) {
      outer_scope = "the global scope";
    } else {
      outer_scope = "\"" + outer_scope + "\"";
    }

    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Note that enum values use C++ scoping rules, meaning that "
             "enum values are siblings of their type, not children of it.  "
             "Therefore, \"" +
                 result->name() + "\" must be unique within " + outer_scope +
                 ", not just within \"" + parent->name() + "\".");
  }

  // An enum is allowed to define two numbers that refer to the same value.
  // FindValueByNumber() should return the first such value, so we simply
  // ignore AddEnumValueByNumber()'s return code.
  file_tables_->AddEnumValueByNumber(result);
}